

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O3

SubControl __thiscall QSliderPrivate::newHoverControl(QSliderPrivate *this,QPoint *pos)

{
  QRect *pQVar1;
  undefined8 uVar2;
  QWidget *this_00;
  char cVar3;
  QStyle *pQVar4;
  long lVar5;
  SubControl SVar6;
  bool bVar7;
  undefined8 *puVar8;
  QStyleOptionSlider *pQVar9;
  long in_FS_OFFSET;
  QStyleOptionSlider opt;
  QRect local_e8;
  QRect local_d8;
  QRect local_c8;
  QStyleOptionSlider local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  puVar8 = &DAT_006dcd20;
  pQVar9 = &local_b8;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar2 = *puVar8;
    (pQVar9->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar2;
    (pQVar9->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar2 >> 0x20);
    puVar8 = puVar8 + 1;
    pQVar9 = (QStyleOptionSlider *)&(pQVar9->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&local_b8);
  (**(code **)(*(long *)this_00 + 0x1a8))(this_00,&local_b8);
  local_b8.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)(QFlagsStorage<QStyle::SubControl>)0xffffffff;
  pQVar4 = QWidget::style(this_00);
  SVar6 = SC_ComboBoxEditField;
  local_c8 = (QRect)(**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,3,&local_b8,2,this_00);
  pQVar4 = QWidget::style(this_00);
  local_d8 = (QRect)(**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,3,&local_b8,1,this_00);
  pQVar4 = QWidget::style(this_00);
  local_e8 = (QRect)(**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,3,&local_b8,4,this_00);
  bVar7 = SUB81(pos,0);
  cVar3 = QRect::contains((QPoint *)&local_c8,bVar7);
  if (cVar3 == '\0') {
    cVar3 = QRect::contains((QPoint *)&local_d8,bVar7);
    if (cVar3 == '\0') {
      SVar6 = SC_None;
      cVar3 = QRect::contains((QPoint *)&local_e8,bVar7);
      pQVar1 = &this->hoverRect;
      if (cVar3 == '\0') {
        pQVar1->x1 = 0;
        pQVar1->y1 = 0;
        (this->hoverRect).x2 = -1;
        (this->hoverRect).y2 = -1;
      }
      else {
        *pQVar1 = local_e8;
        SVar6 = SC_ComboBoxArrow;
      }
    }
    else {
      this->hoverRect = local_d8;
      SVar6 = SC_ComboBoxFrame;
    }
  }
  else {
    this->hoverRect = local_c8;
  }
  this->hoverControl = SVar6;
  QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SVar6;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QSliderPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QSlider);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    QRect handleRect = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderHandle, q);
    QRect grooveRect = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderGroove, q);
    QRect tickmarksRect = q->style()->subControlRect(QStyle::CC_Slider, &opt, QStyle::SC_SliderTickmarks, q);

    if (handleRect.contains(pos)) {
        hoverRect = handleRect;
        hoverControl = QStyle::SC_SliderHandle;
    } else if (grooveRect.contains(pos)) {
        hoverRect = grooveRect;
        hoverControl = QStyle::SC_SliderGroove;
    } else if (tickmarksRect.contains(pos)) {
        hoverRect = tickmarksRect;
        hoverControl = QStyle::SC_SliderTickmarks;
    } else {
        hoverRect = QRect();
        hoverControl = QStyle::SC_None;
    }

    return hoverControl;
}